

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

iterator __thiscall
QMultiMap<std::_List_iterator<Item>,_Lookback>::insert
          (QMultiMap<std::_List_iterator<Item>,_Lookback> *this,_List_iterator<Item> *key,
          Lookback *value)

{
  QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>
  *pQVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  const_iterator __position;
  long in_FS_OFFSET;
  bool bVar4;
  QMultiMap<std::_List_iterator<Item>,_Lookback> copy;
  pair<const_std::_List_iterator<Item>,_Lookback> local_48;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>_>
  local_30;
  _Alloc_node local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>_*>
          )(QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>
            *)0x0;
  }
  else {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_30.d.ptr !=
        (QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>
         *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>
                          *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  pQVar1 = (this->d).d.ptr;
  p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  __position._M_node = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      bVar4 = *(_List_node_base **)(p_Var2 + 1) < key->_M_node;
      if (!bVar4) {
        __position._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar4];
    } while (p_Var2 != (_Base_ptr)0x0);
  }
  local_28._M_t = &(pQVar1->m)._M_t;
  local_48.first = (_List_iterator<Item>)key->_M_node;
  local_48.second.state._M_node = (value->state)._M_node;
  local_48.second.nt._M_node = (value->nt)._M_node;
  iVar3 = std::
          _Rb_tree<std::_List_iterator<Item>,std::pair<std::_List_iterator<Item>const,Lookback>,std::_Select1st<std::pair<std::_List_iterator<Item>const,Lookback>>,std::less<std::_List_iterator<Item>>,std::allocator<std::pair<std::_List_iterator<Item>const,Lookback>>>
          ::
          _M_insert_equal_<std::pair<std::_List_iterator<Item>const,Lookback>,std::_Rb_tree<std::_List_iterator<Item>,std::pair<std::_List_iterator<Item>const,Lookback>,std::_Select1st<std::pair<std::_List_iterator<Item>const,Lookback>>,std::less<std::_List_iterator<Item>>,std::allocator<std::pair<std::_List_iterator<Item>const,Lookback>>>::_Alloc_node>
                    ((_Rb_tree<std::_List_iterator<Item>,std::pair<std::_List_iterator<Item>const,Lookback>,std::_Select1st<std::pair<std::_List_iterator<Item>const,Lookback>>,std::less<std::_List_iterator<Item>>,std::allocator<std::pair<std::_List_iterator<Item>const,Lookback>>>
                      *)local_28._M_t,__position,&local_48,&local_28);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)(iterator)iVar3._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }